

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_merge_sort_recursive(int64_t *newdst,int64_t *dst,size_t size)

{
  int64_t *size_00;
  int64_t *in_RDX;
  int64_t *piVar1;
  int64_t *in_RSI;
  void *in_RDI;
  size_t j;
  size_t i;
  size_t out;
  size_t middle;
  int64_t *piVar2;
  int64_t *local_28;
  int64_t *size_01;
  
  size_00 = (int64_t *)((ulong)in_RDX >> 1);
  local_28 = (int64_t *)0x0;
  piVar2 = (int64_t *)0x0;
  if ((int64_t *)0x1 < in_RDX) {
    if (in_RDX < (int64_t *)0x11) {
      sorter_binary_insertion_sort((int64_t *)0x0,(size_t)size_00);
    }
    else {
      size_01 = size_00;
      sorter_merge_sort_recursive(in_RSI,in_RDX,(size_t)size_00);
      sorter_merge_sort_recursive(in_RSI,in_RDX,(size_t)size_01);
      for (; local_28 != in_RDX; local_28 = (int64_t *)((long)local_28 + 1)) {
        if (piVar2 < size_01) {
          piVar1 = size_00;
          if (size_00 < in_RDX) {
            if (in_RSI[(long)piVar2] - in_RSI[(long)size_00] < 1) {
              *(int64_t *)((long)in_RDI + (long)local_28 * 8) = in_RSI[(long)piVar2];
              piVar2 = (int64_t *)((long)piVar2 + 1);
            }
            else {
              piVar1 = (int64_t *)((long)size_00 + 1);
              *(int64_t *)((long)in_RDI + (long)local_28 * 8) = in_RSI[(long)size_00];
            }
          }
          else {
            *(int64_t *)((long)in_RDI + (long)local_28 * 8) = in_RSI[(long)piVar2];
            piVar2 = (int64_t *)((long)piVar2 + 1);
          }
        }
        else {
          *(int64_t *)((long)in_RDI + (long)local_28 * 8) = in_RSI[(long)size_00];
          piVar1 = (int64_t *)((long)size_00 + 1);
        }
        size_00 = piVar1;
      }
      memcpy(in_RSI,in_RDI,(long)in_RDX << 3);
    }
  }
  return;
}

Assistant:

void MERGE_SORT_RECURSIVE(SORT_TYPE *newdst, SORT_TYPE *dst,
                          const size_t size) {
  const size_t middle = size / 2;
  size_t out = 0;
  size_t i = 0;
  size_t j = middle;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  if (size <= SMALL_SORT_BND) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  MERGE_SORT_RECURSIVE(newdst, dst, middle);
  MERGE_SORT_RECURSIVE(newdst, &dst[middle], size - middle);

  while (out != size) {
    if (i < middle) {
      if (j < size) {
        if (SORT_CMP(dst[i], dst[j]) <= 0) {
          newdst[out] = dst[i++];
        } else {
          newdst[out] = dst[j++];
        }
      } else {
        newdst[out] = dst[i++];
      }
    } else {
      newdst[out] = dst[j++];
    }

    out++;
  }

  SORT_TYPE_CPY(dst, newdst, size);
}